

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scavenger.cpp
# Opt level: O2

void __thiscall pstore::broker::scavenger::thread_entry(scavenger *this)

{
  double __x;
  double __x_00;
  double __x_01;
  not_null<const_char_*> local_78;
  not_null<const_char_*> local_70;
  shared_ptr<pstore::broker::command_processor> scp;
  seconds sleep_time;
  unique_lock<std::mutex> lock;
  not_null<const_char_*> local_40 [2];
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mut_);
  sleep_time.__r = 600;
  while( true ) {
    std::condition_variable::wait_for<long,std::ratio<1l,1l>>(&this->cv_,&lock,&sleep_time);
    local_70.ptr_ = "begin scavenging";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_70);
    log((pstore *)0x6,__x);
    if ((done & 1) != 0) break;
    std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&scp.
                super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>,
               &this->cp_);
    if (scp.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      command_processor::scavenge
                (scp.
                 super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scp.
                super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_78.ptr_ = "scavenging done";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_78);
    log((pstore *)0x6,__x_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  local_40[0].ptr_ = "scavenger thread exiting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(local_40);
  log((pstore *)0x6,__x_01);
  return;
}

Assistant:

void scavenger::thread_entry () {
            try {
                std::unique_lock<decltype (mut_)> lock (mut_);
                auto const sleep_time =
                    std::chrono::seconds (10 * 60); // TODO: make this configurable by the user.
                for (;;) {
                    cv_.wait_for (lock, sleep_time);
                    log (logger::priority::info, "begin scavenging");
                    if (done) {
                        break;
                    }

                    // If the command processor still exists, ask it to scavenge any stale records.
                    if (auto const scp = cp_.lock ()) {
                        scp->scavenge ();
                    }

                    log (logger::priority::info, "scavenging done");
                }
            } catch (std::exception const & ex) {
                log (logger::priority::error, "error:", ex.what ());
            } catch (...) {
                log (logger::priority::error, "unknown exception");
            }
            log (logger::priority::info, "scavenger thread exiting");
        }